

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_readSkippableFrame
                 (void *dst,size_t dstCapacity,uint *magicVariant,void *src,size_t srcSize)

{
  uint uVar1;
  size_t sVar2;
  size_t __n;
  
  if (7 < srcSize) {
    sVar2 = (ulong)*(uint *)((long)src + 4) + 8;
    if (srcSize < sVar2) {
      sVar2 = 0xffffffffffffffb8;
    }
    if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
      sVar2 = 0xfffffffffffffff2;
    }
    uVar1 = *src;
    __n = 0xfffffffffffffff2;
    if (((uVar1 & 0xfffffff0) == 0x184d2a50) && (__n = 0xffffffffffffffb8, sVar2 <= srcSize)) {
      __n = sVar2 - 8;
      if (dstCapacity < __n) {
        __n = 0xffffffffffffffba;
      }
      else {
        if ((dst != (void *)0x0) && (__n != 0)) {
          memcpy(dst,(void *)((long)src + 8),__n);
        }
        if (magicVariant != (uint *)0x0) {
          *magicVariant = uVar1 + 0xe7b2d5b0;
        }
      }
    }
    return __n;
  }
  return 0xffffffffffffffb8;
}

Assistant:

size_t ZSTD_readSkippableFrame(void* dst, size_t dstCapacity,
                               unsigned* magicVariant,  /* optional, can be NULL */
                         const void* src, size_t srcSize)
{
    RETURN_ERROR_IF(srcSize < ZSTD_SKIPPABLEHEADERSIZE, srcSize_wrong, "");

    {   U32 const magicNumber = MEM_readLE32(src);
        size_t skippableFrameSize = readSkippableFrameSize(src, srcSize);
        size_t skippableContentSize = skippableFrameSize - ZSTD_SKIPPABLEHEADERSIZE;

        /* check input validity */
        RETURN_ERROR_IF(!ZSTD_isSkippableFrame(src, srcSize), frameParameter_unsupported, "");
        RETURN_ERROR_IF(skippableFrameSize < ZSTD_SKIPPABLEHEADERSIZE || skippableFrameSize > srcSize, srcSize_wrong, "");
        RETURN_ERROR_IF(skippableContentSize > dstCapacity, dstSize_tooSmall, "");

        /* deliver payload */
        if (skippableContentSize > 0  && dst != NULL)
            ZSTD_memcpy(dst, (const BYTE *)src + ZSTD_SKIPPABLEHEADERSIZE, skippableContentSize);
        if (magicVariant != NULL)
            *magicVariant = magicNumber - ZSTD_MAGIC_SKIPPABLE_START;
        return skippableContentSize;
    }
}